

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawCylinder
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar halfHeight,int upAxis,
          cbtTransform *transform,cbtVector3 *color)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int i;
  uint uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined8 uVar18;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar19 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar20 [64];
  undefined1 auVar25 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  cbtVector3 cVar26;
  float local_c8;
  float fStack_c4;
  cbtVector3 local_b8;
  cbtVector3 local_a8;
  cbtVector3 local_98;
  cbtVector3 local_88;
  cbtVector3 local_78;
  long local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  auVar20._4_60_ = in_register_00001244;
  auVar20._0_4_ = halfHeight;
  uVar2 = *(ulong *)(transform->m_origin).m_floats;
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(auVar20._0_16_,auVar8);
  lVar7 = (long)upAxis;
  local_c8 = (float)uVar2;
  fStack_c4 = (float)(uVar2 >> 0x20);
  fVar1 = (transform->m_origin).m_floats[2];
  local_98.m_floats._0_12_ = ZEXT812(0);
  local_98.m_floats[3] = 0.0;
  local_78.m_floats = local_98.m_floats;
  local_78.m_floats[lVar7] = halfHeight;
  local_88.m_floats = local_98.m_floats;
  local_88.m_floats[lVar7] = auVar8._0_4_;
  local_98.m_floats[lVar7] = halfHeight;
  iVar4 = (upAxis + 1) % 3;
  iVar5 = (upAxis + 2) % 3;
  local_68 = lVar7;
  for (uVar6 = 0; lVar7 = local_68, uVar6 < 0x168; uVar6 = uVar6 + 0x1e) {
    fVar9 = sinf((float)(int)uVar6 * 0.017453292);
    local_88.m_floats[iVar4] = fVar9 * radius;
    local_98.m_floats[iVar4] = fVar9 * radius;
    fVar9 = cosf((float)(int)uVar6 * 0.017453292);
    uVar18 = 0;
    local_88.m_floats[iVar5] = fVar9 * radius;
    local_98.m_floats[iVar5] = fVar9 * radius;
    cVar26 = ::operator*(&transform->m_basis,&local_88);
    auVar10._0_4_ = cVar26.m_floats[0] + local_c8;
    auVar10._4_4_ = cVar26.m_floats[1] + fStack_c4;
    auVar10._8_4_ = (float)uVar18 + 0.0;
    auVar10._12_4_ = (float)((ulong)uVar18 >> 0x20) + 0.0;
    local_a8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar10,ZEXT416((uint)(cVar26.m_floats[2] + fVar1)),0x28);
    uVar18 = local_a8.m_floats._8_8_;
    cVar26 = ::operator*(&transform->m_basis,&local_98);
    auVar11._0_4_ = cVar26.m_floats[0] + local_c8;
    auVar11._4_4_ = cVar26.m_floats[1] + fStack_c4;
    auVar11._8_4_ = (float)uVar18 + 0.0;
    auVar11._12_4_ = (float)((ulong)uVar18 >> 0x20) + 0.0;
    local_b8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar11,ZEXT416((uint)(cVar26.m_floats[2] + fVar1)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,&local_a8,&local_b8,color);
  }
  auVar19 = ZEXT856(0);
  local_a8.m_floats = (cbtScalar  [4])ZEXT816(0);
  local_b8.m_floats = (cbtScalar  [4])ZEXT816(0);
  local_b8.m_floats[iVar4] = 1.0;
  local_a8.m_floats[lVar7] = 1.0;
  cVar26 = ::operator*(&transform->m_basis,&local_78);
  auVar13._0_8_ = cVar26.m_floats._0_8_;
  auVar13._8_56_ = auVar19;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar2;
  auVar8 = vsubps_avx(auVar3,auVar13._0_16_);
  auVar25 = (undefined1  [56])0x0;
  local_40 = vinsertps_avx(auVar8,ZEXT416((uint)(fVar1 - cVar26.m_floats[2])),0x28);
  auVar19 = ZEXT856(local_40._8_8_);
  cVar26 = ::operator*(&transform->m_basis,&local_a8);
  auVar21._0_8_ = cVar26.m_floats._8_8_;
  auVar21._8_56_ = auVar25;
  auVar14._0_8_ = cVar26.m_floats._0_8_;
  auVar14._8_56_ = auVar19;
  local_50 = vmovlhps_avx(auVar14._0_16_,auVar21._0_16_);
  auVar19 = ZEXT856(local_50._8_8_);
  cVar26 = ::operator*(&transform->m_basis,&local_b8);
  auVar22._0_8_ = cVar26.m_floats._8_8_;
  auVar22._8_56_ = auVar25;
  auVar15._0_8_ = cVar26.m_floats._0_8_;
  auVar15._8_56_ = auVar19;
  local_60 = vmovlhps_avx(auVar15._0_16_,auVar22._0_16_);
  uVar18 = 0;
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,local_40,local_50,local_60,color,0);
  cVar26 = ::operator*(&transform->m_basis,&local_78);
  auVar12._0_4_ = cVar26.m_floats[0] + local_c8;
  auVar12._4_4_ = cVar26.m_floats[1] + fStack_c4;
  auVar12._8_4_ = (float)uVar18 + 0.0;
  auVar12._12_4_ = (float)((ulong)uVar18 >> 0x20) + 0.0;
  auVar25 = (undefined1  [56])0x0;
  local_40 = vinsertps_avx(auVar12,ZEXT416((uint)(cVar26.m_floats[2] + fVar1)),0x28);
  auVar19 = ZEXT856(local_40._8_8_);
  cVar26 = ::operator*(&transform->m_basis,&local_a8);
  auVar23._0_8_ = cVar26.m_floats._8_8_;
  auVar23._8_56_ = auVar25;
  auVar16._0_8_ = cVar26.m_floats._0_8_;
  auVar16._8_56_ = auVar19;
  local_50 = vmovlhps_avx(auVar16._0_16_,auVar23._0_16_);
  auVar19 = ZEXT856(local_50._8_8_);
  cVar26 = ::operator*(&transform->m_basis,&local_b8);
  auVar24._0_8_ = cVar26.m_floats._8_8_;
  auVar24._8_56_ = auVar25;
  auVar17._0_8_ = cVar26.m_floats._0_8_;
  auVar17._8_56_ = auVar19;
  local_60 = vmovlhps_avx(auVar17._0_16_,auVar24._0_16_);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,local_40,local_50,local_60,color,0);
  return;
}

Assistant:

virtual void drawCylinder(cbtScalar radius, cbtScalar halfHeight, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 start = transform.getOrigin();
		cbtVector3 offsetHeight(0, 0, 0);
		offsetHeight[upAxis] = halfHeight;
		int stepDegrees = 30;
		cbtVector3 capStart(0.f, 0.f, 0.f);
		capStart[upAxis] = -halfHeight;
		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = halfHeight;

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = capStart[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = capStart[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * capStart, start + transform.getBasis() * capEnd, color);
		}
		// Drawing top and bottom caps of the cylinder
		cbtVector3 yaxis(0, 0, 0);
		yaxis[upAxis] = cbtScalar(1.0);
		cbtVector3 xaxis(0, 0, 0);
		xaxis[(upAxis + 1) % 3] = cbtScalar(1.0);
		drawArc(start - transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, cbtScalar(10.0));
		drawArc(start + transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, cbtScalar(10.0));
	}